

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O0

void d68851_p000(void)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  uint modes;
  char *str;
  
  uVar1 = dasm_read_imm_16(2);
  pcVar3 = get_ea_mode_str(g_cpu_ir,2);
  if ((uVar1 & 0xfde0) == 0x2000) {
    if ((uVar1 & 0x200) == 0) {
      sprintf(g_dasm_str,"pload   %s, #%d",pcVar3,(ulong)(uVar1 >> 10 & 7));
    }
    else {
      sprintf(g_dasm_str,"pload   #%d, %s",(ulong)(uVar1 >> 10 & 7),pcVar3);
    }
  }
  else if ((uVar1 & 0xe200) == 0x2000) {
    sprintf(g_dasm_str,"pflushr %x, %x, %s",(ulong)(uVar1 & 0x1f),(ulong)(uVar1 >> 5 & 0xf),pcVar3);
  }
  else {
    if (uVar1 == 0xa000) {
      sprintf(g_dasm_str,"pflushr %s",pcVar3);
    }
    if (uVar1 == 0x2800) {
      sprintf(g_dasm_str,"pvalid  VAL, %s",pcVar3);
    }
    else if ((uVar1 & 0xfff8) == 0x2c00) {
      sprintf(g_dasm_str,"pvalid  A%d, %s",(ulong)(uVar1 & 0xf),pcVar3);
    }
    else if ((uVar1 & 0xe000) == 0x8000) {
      sprintf(g_dasm_str,"ptest  #%d, %s",(ulong)(uVar1 & 0x1f),pcVar3);
    }
    else {
      uVar2 = uVar1 >> 0xd & 7;
      if ((uVar2 == 0) || (uVar2 == 2)) {
        if ((uVar1 & 0x100) == 0) {
          if ((uVar1 & 0x200) == 0) {
            sprintf(g_dasm_str,"pmove   %s, %s",pcVar3,g_mmuregs[uVar1 >> 10 & 7]);
          }
          else {
            sprintf(g_dasm_str,"pmove   %s, %s",g_mmuregs[uVar1 >> 10 & 7],pcVar3);
          }
        }
        else if ((uVar1 & 0x200) == 0) {
          sprintf(g_dasm_str,"pmovefd %s, %s",pcVar3,g_mmuregs[uVar1 >> 10 & 7]);
        }
        else {
          sprintf(g_dasm_str,"pmovefd %s, %s",g_mmuregs[uVar1 >> 10 & 7],pcVar3);
        }
      }
      else if (uVar2 == 3) {
        if ((uVar1 & 0x200) == 0) {
          sprintf(g_dasm_str,"pmove   %s, mmusr",pcVar3);
        }
        else {
          sprintf(g_dasm_str,"pmove   mmusr, %s",pcVar3);
        }
      }
      else {
        sprintf(g_dasm_str,"pmove   [unknown form], %s",pcVar3);
      }
    }
  }
  return;
}

Assistant:

static void d68851_p000(void)
{
	char* str;
	uint modes = read_imm_16();

	// do this after fetching the second PMOVE word so we properly get the 3rd if necessary
	str = get_ea_mode_str_32(g_cpu_ir);

	if ((modes & 0xfde0) == 0x2000)	// PLOAD
	{
		if (modes & 0x0200)
		{
	 		sprintf(g_dasm_str, "pload   #%d, %s", (modes>>10)&7, str);
		}
		else
		{
	 		sprintf(g_dasm_str, "pload   %s, #%d", str, (modes>>10)&7);
		}
		return;
	}

	if ((modes & 0xe200) == 0x2000)	// PFLUSH
	{
		sprintf(g_dasm_str, "pflushr %x, %x, %s", modes & 0x1f, (modes>>5)&0xf, str);
		return;
	}

	if (modes == 0xa000)	// PFLUSHR
	{
		sprintf(g_dasm_str, "pflushr %s", str);
	}

	if (modes == 0x2800)	// PVALID (FORMAT 1)
	{
		sprintf(g_dasm_str, "pvalid  VAL, %s", str);
		return;
	}

	if ((modes & 0xfff8) == 0x2c00)	// PVALID (FORMAT 2)
	{
		sprintf(g_dasm_str, "pvalid  A%d, %s", modes & 0xf, str);
		return;
	}

	if ((modes & 0xe000) == 0x8000)	// PTEST
	{
		sprintf(g_dasm_str, "ptest  #%d, %s", modes & 0x1f, str);
		return;
	}

	switch ((modes>>13) & 0x7)
	{
		case 0:	// MC68030/040 form with FD bit
		case 2:	// MC68881 form, FD never set
			if (modes & 0x0100)
			{
				if (modes & 0x0200)
				{
			 		sprintf(g_dasm_str, "pmovefd %s, %s", g_mmuregs[(modes>>10)&7], str);
				}
				else
				{
			 		sprintf(g_dasm_str, "pmovefd %s, %s", str, g_mmuregs[(modes>>10)&7]);
				}
			}
			else
			{
				if (modes & 0x0200)
				{
			 		sprintf(g_dasm_str, "pmove   %s, %s", g_mmuregs[(modes>>10)&7], str);
				}
				else
				{
			 		sprintf(g_dasm_str, "pmove   %s, %s", str, g_mmuregs[(modes>>10)&7]);
				}
			}
			break;

		case 3:	// MC68030 to/from status reg
			if (modes & 0x0200)
			{
		 		sprintf(g_dasm_str, "pmove   mmusr, %s", str);
			}
			else
			{
		 		sprintf(g_dasm_str, "pmove   %s, mmusr", str);
			}
			break;

		default:
			sprintf(g_dasm_str, "pmove   [unknown form], %s", str);
			break;
	}
}